

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void quads(void)

{
  vec3 local_510;
  vec3 local_4f8;
  vec3 local_4e0;
  vec3 local_4c8;
  undefined1 local_4b0 [8];
  camera cam;
  vec3 local_320;
  vec3 local_308;
  undefined1 local_2f0 [32];
  vec3 local_2d0;
  vec3 local_2b8;
  vec3 local_2a0;
  undefined1 local_288 [32];
  vec3 local_268;
  vec3 local_250;
  vec3 local_238;
  undefined1 local_220 [32];
  vec3 local_200;
  vec3 local_1e8;
  vec3 local_1d0;
  undefined1 local_1b8 [32];
  vec3 local_198;
  vec3 local_180;
  vec3 local_168;
  undefined1 local_150 [32];
  vec3 local_130;
  undefined1 local_118 [8];
  shared_ptr<lambertian> lower_teal;
  undefined1 local_f0 [8];
  shared_ptr<lambertian> upper_orange;
  undefined1 local_c8 [8];
  shared_ptr<lambertian> right_blue;
  undefined1 local_a0 [8];
  shared_ptr<lambertian> back_green;
  vec3 local_80;
  undefined1 local_68 [8];
  shared_ptr<lambertian> left_red;
  hittable_list world;
  
  hittable_list::hittable_list
            ((hittable_list *)
             &left_red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  vec3::vec3(&local_80,1.0,0.2,0.2);
  std::make_shared<lambertian,vec3>((vec3 *)local_68);
  vec3::vec3((vec3 *)&right_blue.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,0.2,1.0,0.2);
  std::make_shared<lambertian,vec3>((vec3 *)local_a0);
  vec3::vec3((vec3 *)&upper_orange.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,0.2,0.2,1.0);
  std::make_shared<lambertian,vec3>((vec3 *)local_c8);
  vec3::vec3((vec3 *)&lower_teal.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,1.0,0.5,0.0);
  std::make_shared<lambertian,vec3>((vec3 *)local_f0);
  vec3::vec3(&local_130,0.2,0.8,0.8);
  std::make_shared<lambertian,vec3>((vec3 *)local_118);
  vec3::vec3(&local_168,-3.0,-2.0,5.0);
  vec3::vec3(&local_180,0.0,0.0,-4.0);
  vec3::vec3(&local_198,0.0,4.0,0.0);
  std::make_shared<quad,vec3,vec3,vec3,std::shared_ptr<lambertian>&>
            ((vec3 *)local_150,&local_168,&local_180,(shared_ptr<lambertian> *)&local_198);
  std::shared_ptr<hittable>::shared_ptr<quad,void>
            ((shared_ptr<hittable> *)(local_150 + 0x10),(shared_ptr<quad> *)local_150);
  hittable_list::add((hittable_list *)
                     &left_red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(shared_ptr<hittable> *)(local_150 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_150 + 0x10));
  std::shared_ptr<quad>::~shared_ptr((shared_ptr<quad> *)local_150);
  vec3::vec3(&local_1d0,-2.0,-2.0,0.0);
  vec3::vec3(&local_1e8,4.0,0.0,0.0);
  vec3::vec3(&local_200,0.0,4.0,0.0);
  std::make_shared<quad,vec3,vec3,vec3,std::shared_ptr<lambertian>&>
            ((vec3 *)local_1b8,&local_1d0,&local_1e8,(shared_ptr<lambertian> *)&local_200);
  std::shared_ptr<hittable>::shared_ptr<quad,void>
            ((shared_ptr<hittable> *)(local_1b8 + 0x10),(shared_ptr<quad> *)local_1b8);
  hittable_list::add((hittable_list *)
                     &left_red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(shared_ptr<hittable> *)(local_1b8 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_1b8 + 0x10));
  std::shared_ptr<quad>::~shared_ptr((shared_ptr<quad> *)local_1b8);
  vec3::vec3(&local_238,3.0,-2.0,1.0);
  vec3::vec3(&local_250,0.0,0.0,4.0);
  vec3::vec3(&local_268,0.0,4.0,0.0);
  std::make_shared<quad,vec3,vec3,vec3,std::shared_ptr<lambertian>&>
            ((vec3 *)local_220,&local_238,&local_250,(shared_ptr<lambertian> *)&local_268);
  std::shared_ptr<hittable>::shared_ptr<quad,void>
            ((shared_ptr<hittable> *)(local_220 + 0x10),(shared_ptr<quad> *)local_220);
  hittable_list::add((hittable_list *)
                     &left_red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(shared_ptr<hittable> *)(local_220 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_220 + 0x10));
  std::shared_ptr<quad>::~shared_ptr((shared_ptr<quad> *)local_220);
  vec3::vec3(&local_2a0,-2.0,3.0,1.0);
  vec3::vec3(&local_2b8,4.0,0.0,0.0);
  vec3::vec3(&local_2d0,0.0,0.0,4.0);
  std::make_shared<quad,vec3,vec3,vec3,std::shared_ptr<lambertian>&>
            ((vec3 *)local_288,&local_2a0,&local_2b8,(shared_ptr<lambertian> *)&local_2d0);
  std::shared_ptr<hittable>::shared_ptr<quad,void>
            ((shared_ptr<hittable> *)(local_288 + 0x10),(shared_ptr<quad> *)local_288);
  hittable_list::add((hittable_list *)
                     &left_red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(shared_ptr<hittable> *)(local_288 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_288 + 0x10));
  std::shared_ptr<quad>::~shared_ptr((shared_ptr<quad> *)local_288);
  vec3::vec3(&local_308,-2.0,-3.0,5.0);
  vec3::vec3(&local_320,4.0,0.0,0.0);
  vec3::vec3((vec3 *)(cam.defocus_disk_v.e + 2),0.0,0.0,-4.0);
  std::make_shared<quad,vec3,vec3,vec3,std::shared_ptr<lambertian>&>
            ((vec3 *)local_2f0,&local_308,&local_320,
             (shared_ptr<lambertian> *)(cam.defocus_disk_v.e + 2));
  std::shared_ptr<hittable>::shared_ptr<quad,void>
            ((shared_ptr<hittable> *)(local_2f0 + 0x10),(shared_ptr<quad> *)local_2f0);
  hittable_list::add((hittable_list *)
                     &left_red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(shared_ptr<hittable> *)(local_2f0 + 0x10));
  std::shared_ptr<hittable>::~shared_ptr((shared_ptr<hittable> *)(local_2f0 + 0x10));
  std::shared_ptr<quad>::~shared_ptr((shared_ptr<quad> *)local_2f0);
  camera::camera((camera *)local_4b0);
  local_4b0 = (undefined1  [8])0x3ff0000000000000;
  cam.aspect_ratio._0_4_ = 400;
  cam.aspect_ratio._4_4_ = 100;
  cam.image_width = 0x32;
  vec3::vec3(&local_4c8,0.7,0.8,1.0);
  cam.background.e[1] = local_4c8.e[2];
  cam._16_8_ = local_4c8.e[0];
  cam.background.e[0] = local_4c8.e[1];
  cam.background.e[2] = 80.0;
  vec3::vec3(&local_4e0,0.0,0.0,9.0);
  cam.lookfrom.e[1] = local_4e0.e[2];
  cam.vfov = local_4e0.e[0];
  cam.lookfrom.e[0] = local_4e0.e[1];
  vec3::vec3(&local_4f8,0.0,0.0,0.0);
  cam.lookat.e[1] = local_4f8.e[2];
  cam.lookfrom.e[2] = local_4f8.e[0];
  cam.lookat.e[0] = local_4f8.e[1];
  vec3::vec3(&local_510,0.0,1.0,0.0);
  cam.vup.e[1] = local_510.e[2];
  cam.lookat.e[2] = local_510.e[0];
  cam.vup.e[0] = local_510.e[1];
  cam.vup.e[2] = 0.0;
  camera::render((camera *)local_4b0,
                 (hittable *)
                 &left_red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)local_118);
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)local_f0);
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)local_c8);
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)local_a0);
  std::shared_ptr<lambertian>::~shared_ptr((shared_ptr<lambertian> *)local_68);
  hittable_list::~hittable_list
            ((hittable_list *)
             &left_red.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void quads() {
    hittable_list world;

    // Materials
    auto left_red     = make_shared<lambertian>(color(1.0, 0.2, 0.2));
    auto back_green   = make_shared<lambertian>(color(0.2, 1.0, 0.2));
    auto right_blue   = make_shared<lambertian>(color(0.2, 0.2, 1.0));
    auto upper_orange = make_shared<lambertian>(color(1.0, 0.5, 0.0));
    auto lower_teal   = make_shared<lambertian>(color(0.2, 0.8, 0.8));

    // Quads
    world.add(make_shared<quad>(point3(-3,-2, 5), vec3(0, 0,-4), vec3(0, 4, 0), left_red));
    world.add(make_shared<quad>(point3(-2,-2, 0), vec3(4, 0, 0), vec3(0, 4, 0), back_green));
    world.add(make_shared<quad>(point3( 3,-2, 1), vec3(0, 0, 4), vec3(0, 4, 0), right_blue));
    world.add(make_shared<quad>(point3(-2, 3, 1), vec3(4, 0, 0), vec3(0, 0, 4), upper_orange));
    world.add(make_shared<quad>(point3(-2,-3, 5), vec3(4, 0, 0), vec3(0, 0,-4), lower_teal));

    camera cam;

    cam.aspect_ratio      = 1.0;
    cam.image_width       = 400;
    cam.samples_per_pixel = 100;
    cam.max_depth         = 50;
    cam.background        = color(0.70, 0.80, 1.00);

    cam.vfov     = 80;
    cam.lookfrom = point3(0,0,9);
    cam.lookat   = point3(0,0,0);
    cam.vup      = vec3(0,1,0);

    cam.defocus_angle = 0;

    cam.render(world);
}